

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O2

double __thiscall
HighsDomain::getColLowerPos(HighsDomain *this,HighsInt col,HighsInt stackpos,HighsInt *pos)

{
  double dVar1;
  int iVar2;
  pointer ppVar3;
  int *piVar4;
  pointer ppVar5;
  
  ppVar5 = (pointer)((this->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start + col);
  piVar4 = (this->colLowerPos_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start + col;
  ppVar3 = (this->prevboundval_).
           super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  while( true ) {
    dVar1 = ppVar5->first;
    iVar2 = *piVar4;
    *pos = iVar2;
    if ((iVar2 <= stackpos) &&
       (((iVar2 == -1 || (ppVar3[iVar2].first != dVar1)) || (NAN(ppVar3[iVar2].first) || NAN(dVar1))
        ))) break;
    ppVar5 = ppVar3 + iVar2;
    piVar4 = &ppVar3[iVar2].second;
  }
  return dVar1;
}

Assistant:

double HighsDomain::getColLowerPos(HighsInt col, HighsInt stackpos,
                                   HighsInt& pos) const {
  double lb = col_lower_[col];
  pos = colLowerPos_[col];
  while (pos > stackpos || (pos != -1 && prevboundval_[pos].first == lb)) {
    lb = prevboundval_[pos].first;
    pos = prevboundval_[pos].second;
  }
  return lb;
}